

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void apx_istream_write(apx_istream_t *self,uint8_t *chunk,uint32_t chunk_len)

{
  adt_bytearray_t *self_00;
  uint8_t uVar1;
  _func_apx_error_t_void_ptr_char_ptr_char_ptr *p_Var2;
  uint32_t uVar3;
  apx_error_t aVar4;
  uint8_t *puVar5;
  uint8_t *puVar6;
  uint8_t *pEnd;
  uint8_t *pBegin;
  bool bVar7;
  
  if (chunk_len != 0 && (chunk != (uint8_t *)0x0 && self != (apx_istream_t *)0x0)) {
    self_00 = &self->buf;
    adt_bytearray_append(self_00,chunk,chunk_len);
    puVar5 = adt_bytearray_data(self_00);
    uVar3 = adt_bytearray_length(self_00);
    pEnd = puVar5 + uVar3;
    bVar7 = uVar3 != 0;
    pBegin = puVar5;
    if (bVar7) {
      do {
        puVar6 = bstr_search_val(pBegin,pEnd,'\n');
        if (puVar6 == pBegin) {
          if (*pBegin != '\n') break;
          p_Var2 = (self->handler).new_line;
          if (p_Var2 == (_func_apx_error_t_void_ptr_char_ptr_char_ptr *)0x0) goto LAB_001386eb;
          aVar4 = (*p_Var2)((self->handler).arg,(char *)pBegin,(char *)puVar6);
          self->last_error = aVar4;
          if (aVar4 != 0) {
            return;
          }
        }
        else {
          if (puVar6 <= pBegin) break;
          p_Var2 = (self->handler).new_line;
          if (p_Var2 == (_func_apx_error_t_void_ptr_char_ptr_char_ptr *)0x0) {
LAB_001386eb:
            self->last_error = 1;
            return;
          }
          uVar1 = puVar6[-1];
          if (uVar1 == '\r') {
            puVar6 = puVar6 + -1;
          }
          aVar4 = (*p_Var2)((self->handler).arg,(char *)pBegin,(char *)puVar6);
          self->last_error = aVar4;
          if (aVar4 != 0) {
            return;
          }
          pBegin = puVar6 + (uVar1 == '\r');
        }
        pBegin = pBegin + 1;
        bVar7 = pBegin < pEnd;
      } while (bVar7);
    }
    if (puVar5 < pBegin) {
      if (pBegin == pEnd) {
        adt_bytearray_clear(self_00);
        return;
      }
      if (bVar7) {
        adt_bytearray_trimLeft(self_00,pBegin);
        return;
      }
      __assert_fail("line_begin < buffer_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/apx/src/stream.c"
                    ,0xcb,"void apx_istream_write(apx_istream_t *, const uint8_t *, uint32_t)");
    }
  }
  return;
}

Assistant:

void apx_istream_write(apx_istream_t* self, uint8_t const* chunk, uint32_t chunk_len)
{
   if ( (self != NULL) && (chunk != NULL) && (chunk_len != 0u) )
   {
      const uint8_t* buffer_begin;
      const uint8_t* buffer_end;
      const uint8_t* line_begin;
      adt_bytearray_append(&self->buf, chunk, chunk_len);
      buffer_begin = line_begin = adt_bytearray_data(&self->buf);
      buffer_end = buffer_begin + adt_bytearray_length(&self->buf);

      while (line_begin < buffer_end)
      {
         const uint8_t* line_end = bstr_search_val(line_begin, buffer_end, (uint8_t)'\n');
         if (line_end == line_begin)
         {
            const uint8_t first_byte = *line_begin;
            if (first_byte == '\n')
            {
               //empty line
               self->last_error = apx_istream_handler_new_line(&self->handler, (const char*) line_begin++, (const char*) line_end);
               if (self->last_error != APX_NO_ERROR)
               {
                  return;
               }
            }
            else
            {
               break; //Wait for next write (or possible close)
            }
         }
         else if (line_end > line_begin)
         {
            size_t eol_size = 1u;
            if (line_end[-1] == '\r')
            {
               line_end--;
               eol_size = 2;
            }
            self->last_error = apx_istream_handler_new_line(&self->handler, (const char*) line_begin, (const char*) line_end);
            if (self->last_error != APX_NO_ERROR)
            {
               return;
            }
            line_begin = line_end + eol_size; //skip past the new-line character(s)
         }
         else
         {
            break; //Wait for more data
         }
      }
      if ( (line_begin > buffer_begin) )
      {
         if (line_begin == buffer_end)
         {
            adt_bytearray_clear(&self->buf);
         }
         else
         {
            assert(line_begin < buffer_end);
            adt_bytearray_trimLeft(&self->buf, line_begin);
         }
      }
   }
}